

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O2

bool __thiscall
DynamicProfileStorageReaderWriter::Init
          (DynamicProfileStorageReaderWriter *this,char16 *filename,char16 *mode,
          bool deleteNonClosed,errno_t *err)

{
  code *pcVar1;
  bool bVar2;
  errno_t eVar3;
  undefined4 *puVar4;
  
  if (this->file != (PAL_FILE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x45,"(file == nullptr)","file == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  eVar3 = _wfopen_unsafe(&this->file,filename,mode);
  if (eVar3 == 0) {
    this->filename = filename;
    this->deleteNonClosed = deleteNonClosed;
  }
  else if (err != (errno_t *)0x0) {
    *err = eVar3;
  }
  return eVar3 == 0;
}

Assistant:

bool DynamicProfileStorageReaderWriter::Init(char16 const * filename, char16 const * mode, bool deleteNonClosed, errno_t * err = nullptr)
{
    AssertOrFailFast(file == nullptr);
    errno_t e = _wfopen_s(&file, filename, mode);
    if (e != 0)
    {
        if (err)
        {
            *err = e;
        }
        return false;
    }
    this->filename = filename;
    this->deleteNonClosed = deleteNonClosed;
    return true;
}